

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_name.c
# Opt level: O0

char * p2sc_name_swap_jhv(char *dateobs,char *telescop,char *instrume,char *detector,char *wavelnth)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 in_RCX;
  undefined8 in_RDI;
  undefined8 in_R8;
  char *ret;
  char *inst;
  char *tele;
  double d [6];
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar5;
  undefined8 in_stack_ffffffffffffff68;
  undefined2 uVar6;
  char *in_stack_ffffffffffffff70;
  double local_68;
  double *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  double local_50;
  double local_48;
  double local_40;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  uVar6 = (undefined2)((ulong)in_stack_ffffffffffffff68 >> 0x30);
  iVar1 = p2sc_string2date(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (iVar1 != 0) {
    _p2sc_msg("p2sc_name_swap_jhv",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_name.c"
              ,0x56,"$Id: p2sc_name.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
              "p2sc_string2date(%s)",in_RDI);
    exit(1);
  }
  pcVar2 = p2sc_strdup_replace(in_stack_ffffffffffffff70,(char)((ushort)uVar6 >> 8),(char)uVar6);
  pcVar3 = p2sc_strdup_replace(in_stack_ffffffffffffff70,(char)((ushort)uVar6 >> 8),(char)uVar6);
  pcVar4 = (char *)g_strdup_printf("%04d_%02d_%02d__%02d_%02d_%02d__%s_%s_%s_%s.",(int)local_68,
                                   (int)(double)in_stack_ffffffffffffffa0,
                                   (int)(double)in_stack_ffffffffffffffa8,(int)local_50,
                                   (int)local_48,CONCAT44(uVar5,(int)local_40),pcVar2,pcVar3,in_RCX,
                                   in_R8);
  g_free(pcVar3);
  g_free(pcVar2);
  return pcVar4;
}

Assistant:

char *p2sc_name_swap_jhv(const char *dateobs, const char *telescop,
                         const char *instrume, const char *detector, const char *wavelnth) {
    double d[6];
    if (p2sc_string2date(dateobs, d))
        P2SC_Msg(LVL_FATAL, "p2sc_string2date(%s)", dateobs);

    /* avoid SDO/AIA */
    char *tele = p2sc_strdup_replace(telescop, '/', '-');
    /* avoid SUVI instrument name */
    char *inst = p2sc_strdup_replace(instrume, ' ', '_');
    /* final . to protect fractional wavelengths */
    char *ret = g_strdup_printf("%04d_%02d_%02d__%02d_%02d_%02d__%s_%s_%s_%s.",
                                (int) d[0], (int) d[1], (int) d[2], (int) d[3],
                                (int) d[4], (int) d[5],
                                tele, inst, detector, wavelnth);
    g_free(inst);
    g_free(tele);

    return ret;
}